

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressedFRQI.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  _Setprecision _Var4;
  ostream *poVar5;
  void *pvVar6;
  size_type sVar7;
  reference this;
  pointer pQVar8;
  size_type sVar9;
  iterator iVar10;
  iterator iVar11;
  reference pvVar12;
  ulong uVar13;
  vector<double,_std::allocator<double>_> *a;
  double dVar14;
  string local_638;
  int local_618;
  allocator<double> local_611;
  int i;
  undefined1 local_608 [8];
  vector<double,_std::allocator<double>_> state;
  undefined1 local_5d0 [8];
  string fileNamePGM;
  string local_590 [36];
  int local_56c;
  ostream local_568 [4];
  int N;
  ofstream ostrm;
  undefined1 local_368 [8];
  string fileNameQASM;
  stringstream qasm;
  ostream local_338 [376];
  double local_1c0;
  double maxgates;
  __normal_iterator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  local_1b0;
  __normal_iterator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  local_1a8;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  local_1a0;
  citer it;
  int local_190;
  int nH;
  int nRY;
  int nCNOT;
  QCircuit<double,_qclab::QObject<double>_> circuit;
  string local_150;
  int local_130;
  int local_12c;
  int zeroPad;
  int s;
  size_t maxval;
  size_t ncols;
  size_t nrows;
  vector<double,_std::allocator<double>_> data;
  string local_f0;
  int local_d0;
  allocator<char> local_c9;
  int sim;
  double local_a8;
  double compr;
  undefined1 local_98 [8];
  string fileNameOut;
  undefined1 local_70 [8];
  string fileNameIn;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
    bVar2 = std::operator==(&local_38,"--help");
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    if (bVar2) {
      poVar5 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"QPIXL++: Compile quantum circuits for image representations")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"***********************************************************")
      ;
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"compressedFRQI requires two mandatory input arguments, ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"and two optional input arguments.");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"1. path to input PGM image file. Image data is expected");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"   in ASCII portable gray map format without comment.");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"2. path and name structure for all output data.");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"   For example : ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"       /mypath/output ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"       This will generate output.qasm, output.pgm, and ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"       output_sim.pgm (depending on optional parameters)");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"       in /mypath/");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"3. (optional) compression level between 0 and 100 percent");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"   default compression level is 0.");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"4. (optional) simulate flag: 0 or 1 to determine if circuit")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"   is simulated with QCLAB++, default is 0.");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      return 0;
    }
  }
  if ((int)argv_local < 3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "ERROR -- input and output filenames are required!");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Use --help for more more .");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return -1;
  }
  pcVar1 = local_18[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,pcVar1,(allocator<char> *)(fileNameOut.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fileNameOut.field_2._M_local_buf + 0xf));
  pcVar1 = local_18[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,pcVar1,(allocator<char> *)((long)&compr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&compr + 7));
  local_a8 = 0.0;
  if (3 < (int)argv_local) {
    pcVar1 = local_18[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&sim,pcVar1,&local_c9);
    local_a8 = std::__cxx11::stod((string *)&sim,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&sim);
    std::allocator<char>::~allocator(&local_c9);
  }
  local_d0 = 0;
  if (4 < (int)argv_local) {
    pcVar1 = local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,pcVar1,
               (allocator<char> *)
               ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_d0 = std::__cxx11::stoi(&local_f0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&nrows);
  local_130 = 2;
  poVar5 = std::operator<<((ostream *)&std::cout," * Reading image data from file.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string
            ((string *)&local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  local_12c = qpixl::readPGMA<std::vector<double,std::allocator<double>>>
                        (&local_150,(vector<double,_std::allocator<double>_> *)&nrows,&ncols,&maxval
                         ,(size_t *)&zeroPad,local_130);
  std::__cxx11::string::~string((string *)&local_150);
  if (local_12c != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- reading input image file");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -2;
    circuit.gates_.
    super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_0010a29d;
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"   Image statistics : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * number of rows             : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,ncols);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * number of columns          : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,maxval);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * maximum pixel value        : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,_zeroPad);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * size of zero padded vector : ");
  sVar7 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&nrows);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar7);
  pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout," * Converting grayscale to angles.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  qpixl::frqi::convertToAngles<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)&nrows,_zeroPad);
  poVar5 = std::operator<<((ostream *)&std::cout," * Compressing FRQI circuit.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            ((QCircuit<double,_qclab::QObject<double>_> *)&nRY,(frqi *)&nrows,a,local_a8);
  nH = 0;
  local_190 = 0;
  iVar3 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  it._M_current._4_4_ = iVar3 + -1;
  local_1a8._M_current =
       (unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_> *)
       qclab::QCircuit<double,_qclab::QObject<double>_>::begin
                 ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>const*,std::vector<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>,std::allocator<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>>>>
  ::
  __normal_iterator<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>*>
            ((__normal_iterator<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>const*,std::vector<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>,std::allocator<std::unique_ptr<qclab::QObject<double>,std::default_delete<qclab::QObject<double>>>>>>
              *)&local_1a0,&local_1a8);
  while( true ) {
    local_1b0._M_current =
         (unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_> *)
         qclab::QCircuit<double,_qclab::QObject<double>_>::end
                   ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
    bVar2 = __gnu_cxx::
            operator==<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
                      (&local_1a0,&local_1b0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this = __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
           ::operator*(&local_1a0);
    pQVar8 = std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
             ::operator->(this);
    iVar3 = (**pQVar8->_vptr_QObject)();
    if (iVar3 == 1) {
      local_190 = local_190 + 1;
    }
    else {
      nH = nH + 1;
    }
    maxgates = (double)__gnu_cxx::
                       __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
                       ::operator++(&local_1a0,0);
  }
  local_190 = local_190 - it._M_current._4_4_;
  iVar3 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  local_1c0 = (double)(1 << ((char)iVar3 - 1U & 0x1f));
  poVar5 = std::operator<<((ostream *)&std::cout," * Writing compressed FRQI circuit to QASM.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream((stringstream *)(fileNameQASM.field_2._M_local_buf + 8));
  qclab::QCircuit<double,_qclab::QObject<double>_>::toQASM
            ((QCircuit<double,_qclab::QObject<double>_> *)&nRY,local_338,0);
  std::__cxx11::string::string((string *)local_368);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,".qasm")
  ;
  std::ofstream::ofstream(local_568,(string *)local_368,_S_out);
  local_56c = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                        ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  poVar5 = std::operator<<(local_568,"// Generated by QPIXL++");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"// https://github.com/QuantumComputingLab/qpixlpp");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//   Circuit statistics : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//     * number of qubits               : ");
  iVar3 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//     * total number of gates          : ");
  sVar9 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbGates
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar9);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//       - number of CNOTs              : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,nH);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//       - number of Ry gates           : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_190);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//       - number of Hadamard gates     : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,it._M_current._4_4_);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//     * Compression setting            : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_a8);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//       - CNOT compression ratio [%]   : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(1.0 - (double)nH / local_1c0) * 100.0);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"//       - Ry compression ratio [%]     : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(1.0 - (double)local_190 / local_1c0) * 100.0);
  pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"OPENQASM 2.0;");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"include \"qelib1.inc\";");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"qreg q[");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_56c);
  poVar5 = std::operator<<(poVar5,"];");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::operator<<(poVar5,local_590);
  std::__cxx11::string::~string(local_590);
  std::ofstream::close();
  std::ostream::operator<<(&std::cout,std::fixed);
  _Var4 = std::setprecision(1);
  std::operator<<((ostream *)&std::cout,_Var4);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"   Circuit statistics : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * number of qubits               : ");
  iVar3 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * total number of gates          : ");
  sVar9 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbGates
                    ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,sVar9);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"       - number of CNOTs              : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,nH);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"       - number of Ry gates           : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_190);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"       - number of Hadamard gates     : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,it._M_current._4_4_);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"     * Compression setting            : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_a8);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"       - CNOT compression ratio [%]   : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(1.0 - (double)nH / local_1c0) * 100.0);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"       - Ry compression ratio [%]     : ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(1.0 - (double)local_190 / local_1c0) * 100.0);
  pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           " * Converting compressed data to grayscale image.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)&nrows);
  qpixl::frqi::isfwht<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)&nrows);
  iVar10 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)&nrows);
  iVar11 = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)&nrows);
  std::
  for_each<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
            (iVar10._M_current,iVar11._M_current);
  qpixl::frqi::convertToGrayscale<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)&nrows,_zeroPad);
  poVar5 = std::operator<<((ostream *)&std::cout," * Writing compressed image to file.. ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)local_5d0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,".pgm");
  std::__cxx11::string::string
            ((string *)
             &state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0);
  local_12c = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                        ((string *)
                         &state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (vector<double,_std::allocator<double>_> *)&nrows,ncols,maxval,_zeroPad,
                         local_130);
  std::__cxx11::string::~string
            ((string *)
             &state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (local_12c == 0) {
    if (local_d0 == 1) {
      iVar3 = qclab::QCircuit<double,_qclab::QObject<double>_>::nbQubits
                        ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
      _i = 0.0;
      std::allocator<double>::allocator(&local_611);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_608,1L << ((byte)iVar3 & 0x3f),
                 (value_type_conflict *)&i,&local_611);
      std::allocator<double>::~allocator(&local_611);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_608,0);
      *pvVar12 = 1.0;
      poVar5 = std::operator<<((ostream *)&std::cout," * Simulating the compressed FRQI circuit.. ")
      ;
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      qclab::QCircuit<double,_qclab::QObject<double>_>::simulate
                ((QCircuit<double,_qclab::QObject<double>_> *)&nRY,
                 (vector<double,_std::allocator<double>_> *)local_608);
      for (local_618 = 0; uVar13 = (ulong)local_618,
          sVar7 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)local_608), uVar13 < sVar7;
          local_618 = local_618 + 2) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_608,
                             (long)(local_618 + 1));
        dVar14 = *pvVar12;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_608,(long)local_618);
        dVar14 = atan2(dVar14,*pvVar12);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_608,
                             (long)(local_618 / 2));
        *pvVar12 = dVar14;
      }
      sVar7 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_608);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)local_608,sVar7 >> 1);
      qpixl::frqi::convertToGrayscale<std::vector<double,std::allocator<double>>>
                ((vector<double,_std::allocator<double>_> *)local_608,_zeroPad);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               " * Writing simulated compressed image to file.. ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "_sim.pgm");
      std::__cxx11::string::string
                ((string *)&local_638,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      local_12c = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                            (&local_638,(vector<double,_std::allocator<double>_> *)local_608,ncols,
                             maxval,_zeroPad,local_130);
      std::__cxx11::string::~string((string *)&local_638);
      circuit.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = local_12c != 0;
      if (circuit.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- writing simulated image file");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -4;
      }
      circuit.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_608);
      if (circuit.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_0010a221;
    }
    argv_local._4_4_ = 0;
    circuit.gates_.
    super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- writing compressed image file");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -3;
    circuit.gates_.
    super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
LAB_0010a221:
  std::__cxx11::string::~string((string *)local_5d0);
  std::ofstream::~ofstream(local_568);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::stringstream::~stringstream((stringstream *)(fileNameQASM.field_2._M_local_buf + 8))
  ;
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit
            ((QCircuit<double,_qclab::QObject<double>_> *)&nRY);
LAB_0010a29d:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&nrows);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  return argv_local._4_4_;
}

Assistant:

int main( int argc , char *argv[] ) {

  // parse input arguments
  if ( argc == 2 ) {
    if ( std::string(argv[1]) == "--help" ) {
      std::cout << std::endl
                << "QPIXL++: Compile quantum circuits for image representations"
                << std::endl
                << "***********************************************************"
                << std::endl << std::endl
                << "compressedFRQI requires two mandatory input arguments, "
                << std::endl << "and two optional input arguments."
                << std::endl << std::endl
                << "1. path to input PGM image file. Image data is expected"
                << std::endl
                << "   in ASCII portable gray map format without comment."
                << std::endl << std::endl
                << "2. path and name structure for all output data."
                << std::endl
                << "   For example : " << std::endl
                << "       /mypath/output " << std::endl
                << "       This will generate output.qasm, output.pgm, and "
                << std::endl
                << "       output_sim.pgm (depending on optional parameters)"
                << std::endl
                << "       in /mypath/"
                << std::endl << std::endl
                << "3. (optional) compression level between 0 and 100 percent"
                << std::endl
                << "   default compression level is 0."
                << std::endl << std::endl
                << "4. (optional) simulate flag: 0 or 1 to determine if circuit"
                << std::endl
                << "   is simulated with QCLAB++, default is 0."
                << std::endl << std::endl ;
      return 0 ;
    }
  }
  if ( argc < 3 ) {
    std::cerr << "ERROR -- input and output filenames are required!" 
              << std::endl 
              << "Use --help for more more ."
              << std::endl ;
    return -1 ;
  }
  std::string fileNameIn(  argv[1] ) ;
  std::string fileNameOut( argv[2] ) ;
  double  compr  = 0 ; if ( argc > 3 ) compr  = std::stod( argv[3] ) ;
  int sim = 0 ; if ( argc > 4 ) sim = std::stoi( argv[4] ) ;

  // Read grayscale image data
  std::vector< double > data ;
  size_t nrows, ncols, maxval ;
  int s, zeroPad = 2 ;
  std::cout << " * Reading image data from file.. " << std::endl ;
  s = qpixl::readPGMA(fileNameIn , data , nrows , ncols , maxval , zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- reading input image file" << std::endl;
    return -2 ;
  }

  // Image statistics
  std::cout << std::endl
              << "   Image statistics : " << std::endl
              << "     * number of rows             : " << nrows << std::endl
              << "     * number of columns          : " << ncols << std::endl
              << "     * maximum pixel value        : " << maxval << std::endl
              << "     * size of zero padded vector : " << data.size() 
              << std::endl << std::endl ;
    
  // Convert data to angles for FRQI
  std::cout << " * Converting grayscale to angles.. " << std::endl ;
  qpixl::frqi::convertToAngles( data , maxval ) ;

  // Create compressed FRQI circuit
  std::cout << " * Compressing FRQI circuit.. " << std::endl ;
  auto circuit = qpixl::frqi::compressedFRQICircuit( data , compr ) ;

  // Count CNOTs and single qubit gates in FRQI circuit
  int nCNOT = 0, nRY = 0 ;
  const int nH = circuit.nbQubits() - 1 ;
  using citer  = typename qclab::QCircuit< double >::const_iterator ;
  for ( citer it = circuit.begin(); it !=circuit.end(); it++ ) {
    if ( (*it)->nbQubits() == 1 ) nRY += 1 ;
    else nCNOT += 1 ;
  }
  nRY -= nH ;
  
  const double maxgates = int(1)<<(circuit.nbQubits()-1) ;

  // Write QASM to file
  std::cout << " * Writing compressed FRQI circuit to QASM.. " << std::endl ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::string fileNameQASM ;
  fileNameQASM.append( fileNameOut ) ;
  fileNameQASM.append( ".qasm" ) ;
  std::ofstream ostrm( fileNameQASM , std::ios::out ) ;
  const int N = circuit.nbQubits() ;
  ostrm << "// Generated by QPIXL++" << std::endl
        << "// https://github.com/QuantumComputingLab/qpixlpp" << std::endl
        << std::endl << std::endl
        << "//   Circuit statistics : " << std::endl
        << "//     * number of qubits               : " 
        << circuit.nbQubits() << std::endl
        << "//     * total number of gates          : " << circuit.nbGates()
        << std::endl
        << "//       - number of CNOTs              : " << nCNOT 
        << std::endl
        << "//       - number of Ry gates           : " << nRY 
        << std::endl
        << "//       - number of Hadamard gates     : " << nH 
        << std::endl
        << "//     * Compression setting            : " << compr
        << std::endl
        << "//       - CNOT compression ratio [%]   : " 
        << (1.0 - (double(nCNOT)/maxgates))*100
        << std::endl
        << "//       - Ry compression ratio [%]     : " 
        << (1.0 - (double(nRY)/maxgates))*100
        << std::endl << std::endl
        << "OPENQASM 2.0;" << std::endl
        << "include \"qelib1.inc\";" << std::endl << std::endl
        << "qreg q[" << N << "];" << std::endl
        << qasm.str() ;
  ostrm.close() ;

  // Circuit statistics
  std::cout << std::fixed ;
  std::cout << std::setprecision(1) ;
  std::cout << std::endl
            << "   Circuit statistics : " << std::endl
            << "     * number of qubits               : " 
            << circuit.nbQubits() << std::endl
            << "     * total number of gates          : " << circuit.nbGates()
            << std::endl
            << "       - number of CNOTs              : " << nCNOT 
            << std::endl
            << "       - number of Ry gates           : " << nRY
            << std::endl
            << "       - number of Hadamard gates     : " << nH 
            << std::endl
            << "     * Compression setting            : " << compr
            << std::endl
            << "       - CNOT compression ratio [%]   : " 
            << (1.0 - (double(nCNOT)/maxgates))*100
            << std::endl
            << "       - Ry compression ratio [%]     : " 
            << (1.0 - (double(nRY)/maxgates))*100
            << std::endl << std::endl ;

  // Transform data back to binary order, inverse FWHT, and grayscale map
  std::cout << " * Converting compressed data to grayscale image.. " 
            << std::endl ;

  qpixl::frqi::invGrayPermutation( data ) ;
  qpixl::frqi::isfwht( data ) ; 
  std::for_each( data.begin(), data.end(), []( double& n ){ n /= 2; } ) ;       
  qpixl::frqi::convertToGrayscale( data , maxval ) ;

  // Write image data to PGM
  std::cout << " * Writing compressed image to file.. " << std::endl ;
  std::string fileNamePGM ;
  fileNamePGM.append( fileNameOut ) ;
  fileNamePGM.append( ".pgm" ) ;
  s = qpixl::writePGMA(fileNamePGM , data , nrows , ncols , maxval ,
                       zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- writing compressed image file" << std::endl;
    return -3 ;
  }

  // Simulate the circuit
  if ( sim == 1 ) { 

    // Initial state vector
    std::vector< double > state( (size_t(1)<<circuit.nbQubits()) , 0.0 );
    state[0] = 1.0 ;
    
    // Simulate
    std::cout << " * Simulating the compressed FRQI circuit.. " << std::endl ;
    circuit.simulate( state ) ;
    
    // Recover simulated image data from state vector
    for ( int i = 0; i < state.size(); i+=2 ) {
      state[i/2] = std::atan2( state[i+1] , state[i] ) ;
    }
    state.resize( state.size()/2 ) ;
    qpixl::frqi::convertToGrayscale( state , maxval ) ;

    // Write simulated image data to PGM
    std::cout << " * Writing simulated compressed image to file.. " 
              << std::endl ;
    fileNameOut.append( "_sim.pgm" ) ;
    s = qpixl::writePGMA(fileNameOut , state , nrows , ncols , maxval , 
                         zeroPad) ;

    if ( s != 0 ) {
      std::cerr << "ERROR -- writing simulated image file" << std::endl;
      return -4 ;
    }
  }

  // successful
  return 0 ;    
    
}